

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::MethodHeader::MethodHeader
          (MethodHeader *this,string *selector,ArgumentList *arguments)

{
  ArgumentList *arguments_local;
  string *selector_local;
  MethodHeader *this_local;
  
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MethodHeader_0020cdf0;
  std::__cxx11::string::string((string *)&this->selector,(string *)selector);
  this->arguments = arguments;
  return;
}

Assistant:

MethodHeader::MethodHeader(const std::string &selector, ArgumentList *arguments)
	: selector(selector), arguments(arguments)
{
}